

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O2

void kj::anon_unknown_6::registerReservedSignal(void)

{
  __sighandler_t p_Var1;
  int *piVar2;
  Fault f;
  
  registerSignalHandler((anonymous_namespace)::reservedSignal);
  do {
    p_Var1 = signal(0xd,(__sighandler_t)0x1);
    if (p_Var1 != (__sighandler_t)0xffffffffffffffff) {
      return;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  kj::_::Debug::Fault::Fault
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix.c++"
             ,0x6b,*piVar2,"signal(SIGPIPE, SIG_IGN)","");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void registerReservedSignal() {
  registerSignalHandler(reservedSignal);

  // We also disable SIGPIPE because users of UnixEventPort almost certainly don't want it.
  while (signal(SIGPIPE, SIG_IGN) == SIG_ERR) {
    int error = errno;
    if (error != EINTR) {
      KJ_FAIL_SYSCALL("signal(SIGPIPE, SIG_IGN)", error);
    }
  }
}